

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyIntPropertyValue
          (UnicodeSet *this,UProperty prop,int32_t value,UErrorCode *ec)

{
  UBool UVar1;
  USet *uset;
  UnicodeSet *o;
  UCPMap *map_00;
  UCPMap *map_1;
  USet *set;
  UnicodeSet *pUStack_38;
  UScriptCode script;
  UnicodeSet *inclusions;
  UCPMap *map;
  UErrorCode *ec_local;
  int32_t value_local;
  UProperty prop_local;
  UnicodeSet *this_local;
  
  map = (UCPMap *)ec;
  ec_local._0_4_ = value;
  ec_local._4_4_ = prop;
  _value_local = this;
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    if (ec_local._4_4_ == UCHAR_GENERAL_CATEGORY_MASK) {
      inclusions = (UnicodeSet *)u_getIntPropertyMap_63(UCHAR_GENERAL_CATEGORY,(UErrorCode *)map);
      applyIntPropertyValue
                (this,(UCPMap *)inclusions,anon_unknown_0::generalCategoryMaskFilter,&ec_local,
                 (UErrorCode *)map);
    }
    else if (ec_local._4_4_ == UCHAR_OTHER_PROPERTY_START) {
      pUStack_38 = CharacterProperties::getInclusionsForProperty
                             (UCHAR_OTHER_PROPERTY_START,(UErrorCode *)map);
      set._4_4_ = (int32_t)ec_local;
      applyFilter(this,anon_unknown_0::scriptExtensionsFilter,(void *)((long)&set + 4),pUStack_38,
                  (UErrorCode *)map);
    }
    else if ((ec_local._4_4_ < UCHAR_ALPHABETIC) || (UCHAR_EXTENDED_PICTOGRAPHIC < ec_local._4_4_))
    {
      if ((ec_local._4_4_ < UCHAR_BIDI_CLASS) || (UCHAR_VERTICAL_ORIENTATION < ec_local._4_4_)) {
        *(undefined4 *)map = 1;
      }
      else {
        map_00 = u_getIntPropertyMap_63(ec_local._4_4_,(UErrorCode *)map);
        applyIntPropertyValue
                  (this,map_00,anon_unknown_0::intValueFilter,&ec_local,(UErrorCode *)map);
      }
    }
    else if (((int32_t)ec_local == 0) || ((int32_t)ec_local == 1)) {
      uset = u_getBinaryPropertySet_63(ec_local._4_4_,(UErrorCode *)map);
      UVar1 = ::U_FAILURE(*(UErrorCode *)map);
      if (UVar1 == '\0') {
        o = fromUSet(uset);
        copyFrom(this,o,'\x01');
        if ((int32_t)ec_local == 0) {
          complement(this);
        }
      }
    }
    else {
      clear(this);
    }
  }
  return this;
}

Assistant:

UnicodeSet&
UnicodeSet::applyIntPropertyValue(UProperty prop, int32_t value, UErrorCode& ec) {
    if (U_FAILURE(ec)) { return *this; }
    // All of the following check isFrozen() before modifying this set.
    if (prop == UCHAR_GENERAL_CATEGORY_MASK) {
        const UCPMap *map = u_getIntPropertyMap(UCHAR_GENERAL_CATEGORY, &ec);
        applyIntPropertyValue(map, generalCategoryMaskFilter, &value, ec);
    } else if (prop == UCHAR_SCRIPT_EXTENSIONS) {
        const UnicodeSet* inclusions = CharacterProperties::getInclusionsForProperty(prop, ec);
        UScriptCode script = (UScriptCode)value;
        applyFilter(scriptExtensionsFilter, &script, inclusions, ec);
    } else if (0 <= prop && prop < UCHAR_BINARY_LIMIT) {
        if (value == 0 || value == 1) {
            const USet *set = u_getBinaryPropertySet(prop, &ec);
            if (U_FAILURE(ec)) { return *this; }
            copyFrom(*UnicodeSet::fromUSet(set), TRUE);
            if (value == 0) {
                complement();
            }
        } else {
            clear();
        }
    } else if (UCHAR_INT_START <= prop && prop < UCHAR_INT_LIMIT) {
        const UCPMap *map = u_getIntPropertyMap(prop, &ec);
        applyIntPropertyValue(map, intValueFilter, &value, ec);
    } else {
        // This code used to always call getInclusions(property source)
        // which sets an error for an unsupported property.
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        // Otherwise we would just clear() this set because
        // getIntPropertyValue(c, prop) returns 0 for all code points.
    }
    return *this;
}